

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

void __thiscall
pbrt::PiecewiseConstant1D::PiecewiseConstant1D
          (PiecewiseConstant1D *this,span<const_float> f,Float min,Float max,Allocator alloc)

{
  char acVar1 [4];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char (*args_2) [12];
  iterator args_3;
  reference pvVar4;
  size_t index;
  reference file;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  float in_XMM0_Da;
  float fVar5;
  float in_XMM1_Da;
  undefined1 auVar6 [64];
  size_t i_2;
  size_t i_1;
  int vb_1;
  value_type_conflict1 va_1;
  size_t i;
  size_t n;
  Float vb;
  Float va;
  polymorphic_allocator<float> *in_stack_fffffffffffffec0;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffec8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffee0;
  char (*in_stack_ffffffffffffff08) [4];
  undefined4 in_stack_ffffffffffffff10;
  value_type_conflict1 in_stack_ffffffffffffff14;
  reference in_stack_ffffffffffffff18;
  reference in_stack_ffffffffffffff20;
  int line;
  char *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  LogLevel level;
  char (*args_4) [4];
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *args_5;
  ulong local_78;
  ulong local_70;
  ulong local_60;
  char local_30 [8];
  float local_28;
  float local_24;
  span<const_float> local_10;
  
  level = (LogLevel)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  args_5 = in_RDI;
  local_28 = in_XMM1_Da;
  local_24 = in_XMM0_Da;
  args_2 = (char (*) [12])pstd::span<const_float>::begin(&local_10);
  args_3 = pstd::span<const_float>::end(&local_10);
  args_4 = (char (*) [4])local_30;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            (&in_stack_fffffffffffffed0->alloc,in_stack_fffffffffffffec8);
  pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>::vector<float_const*>
            (in_stack_fffffffffffffee0,
             (float *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             (float *)in_stack_fffffffffffffed0,
             (polymorphic_allocator<float> *)in_stack_fffffffffffffec8);
  pstd::span<const_float>::size(&local_10);
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            (&in_stack_fffffffffffffed0->alloc,in_stack_fffffffffffffec8);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  *(float *)&in_RDI[2].alloc.memoryResource = local_24;
  *(float *)((long)&in_RDI[2].alloc.memoryResource + 4) = local_28;
  *(undefined4 *)&in_RDI[2].ptr = 0;
  if (local_28 <= local_24) {
    LogFatal<char_const(&)[4],char_const(&)[4],char_const(&)[4],float&,char_const(&)[4],float&>
              (level,in_stack_ffffffffffffff28,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
               (char *)in_stack_ffffffffffffff18,
               (char (*) [4])CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08,(char (*) [4])args_2,args_3,args_4,(float *)args_5);
  }
  pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[](in_RDI + 1,0);
  *pvVar4 = 0.0;
  index = pstd::span<const_float>::size(&local_10);
  local_60 = 1;
  while( true ) {
    line = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
    if (index + 1 <= local_60) {
      pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         (in_RDI + 1,index);
      *(value_type_conflict1 *)&in_RDI[2].ptr = *pvVar4;
      fVar5 = *(float *)&in_RDI[2].ptr;
      auVar6 = ZEXT1664((undefined1  [16])0x0);
      if ((fVar5 != 0.0) || (NAN(fVar5))) {
        for (local_78 = 1; local_78 < index + 1; local_78 = local_78 + 1) {
          fVar5 = *(float *)&in_RDI[2].ptr;
          pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                             (in_RDI + 1,local_78);
          *pvVar4 = *pvVar4 / fVar5;
        }
      }
      else {
        for (local_70 = 1; local_70 < index + 1; local_70 = local_70 + 1) {
          auVar2 = vcvtusi2ss_avx512f(ZEXT416((uint)fVar5),local_70);
          auVar3 = vcvtusi2ss_avx512f(auVar6._0_16_,index);
          auVar6 = ZEXT1664(auVar3);
          fVar5 = auVar2._0_4_ / auVar3._0_4_;
          pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                             (in_RDI + 1,local_70);
          *pvVar4 = fVar5;
        }
      }
      return;
    }
    file = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                     (in_RDI,local_60 - 1);
    if (*file < 0.0) break;
    in_stack_ffffffffffffff20 =
         pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                   (in_RDI + 1,local_60 - 1);
    in_stack_ffffffffffffff14 = *in_stack_ffffffffffffff20;
    in_stack_ffffffffffffff18 =
         pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                   (in_RDI,local_60 - 1);
    auVar2 = vcvtusi2ss_avx512f(ZEXT416((uint)(local_28 - local_24)),index);
    acVar1 = (char  [4])
             (in_stack_ffffffffffffff14 +
             (*in_stack_ffffffffffffff18 * (local_28 - local_24)) / auVar2._0_4_);
    in_stack_ffffffffffffff08 =
         (char (*) [4])
         pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                   (in_RDI + 1,local_60);
    *in_stack_ffffffffffffff08 = acVar1;
    local_60 = local_60 + 1;
  }
  LogFatal<char_const(&)[12],char_const(&)[2],char_const(&)[12],float&,char_const(&)[2],int&>
            ((LogLevel)((ulong)pvVar4 >> 0x20),(char *)file,line,(char *)in_stack_ffffffffffffff18,
             (char (*) [12])CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (char (*) [2])in_stack_ffffffffffffff08,args_2,args_3,(char (*) [2])args_4,
             (int *)args_5);
}

Assistant:

PiecewiseConstant1D(pstd::span<const Float> f, Float min, Float max,
                        Allocator alloc = {})
        : func(f.begin(), f.end(), alloc), cdf(f.size() + 1, alloc), min(min), max(max) {
        CHECK_GT(max, min);
        // Compute integral of step function at $x_i$
        cdf[0] = 0;
        size_t n = f.size();
        for (size_t i = 1; i < n + 1; ++i) {
            CHECK_GE(func[i - 1], 0);
            cdf[i] = cdf[i - 1] + func[i - 1] * (max - min) / n;
        }

        // Transform step function integral into CDF
        funcInt = cdf[n];
        if (funcInt == 0)
            for (size_t i = 1; i < n + 1; ++i)
                cdf[i] = Float(i) / Float(n);
        else
            for (size_t i = 1; i < n + 1; ++i)
                cdf[i] /= funcInt;
    }